

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cBufferStorageTests.cpp
# Opt level: O0

void __thiscall gl4cts::BufferStorage::Program::Program(Program *this,Context *context)

{
  Context *context_local;
  Program *this_local;
  
  this->m_id = 0;
  BufferStorage::Shader::Shader(&this->m_compute,context);
  BufferStorage::Shader::Shader(&this->m_fragment,context);
  BufferStorage::Shader::Shader(&this->m_geometry,context);
  BufferStorage::Shader::Shader(&this->m_tess_ctrl,context);
  BufferStorage::Shader::Shader(&this->m_tess_eval,context);
  BufferStorage::Shader::Shader(&this->m_vertex,context);
  this->m_context = context;
  return;
}

Assistant:

Program::Program(deqp::Context& context)
	: m_id(m_invalid_id)
	, m_compute(context)
	, m_fragment(context)
	, m_geometry(context)
	, m_tess_ctrl(context)
	, m_tess_eval(context)
	, m_vertex(context)
	, m_context(context)
{
	/* Nothing to be done here */
}